

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O0

void NVMDumpCode(FILE *f,uint8_t *bc,uint32_t len)

{
  uint8_t a_00;
  uint local_28;
  ushort local_22;
  uint32_t pc;
  uint16_t oplen;
  int16_t b;
  uint8_t a;
  uint8_t op;
  uint32_t len_local;
  uint8_t *bc_local;
  FILE *f_local;
  
  for (local_28 = 0; local_28 < len; local_28 = local_22 + local_28) {
    pc._0_2_ = bc[local_28] & 7;
    a_00 = (uint8_t)((int)(uint)bc[local_28] >> 3);
    if ((ushort)pc == 7) {
      local_22 = 3;
      pc._0_2_ = (ushort)bc[local_28 + 1] * 0x100 + (ushort)bc[local_28 + 2];
      if ((a_00 == '\0') && ((ushort)pc == 1)) {
        pc._0_2_ = 7;
      }
    }
    else {
      local_22 = 1;
    }
    NVMDumpInstCode(f,bc,local_28,local_22);
    NVMDumpInstName(f,a_00,(ushort)pc);
    NewtFprintf(f,"\n");
  }
  return;
}

Assistant:

void NVMDumpCode(FILE * f, uint8_t * bc, uint32_t len)
{
    uint8_t	op;
    uint8_t	a;
    int16_t	b;
    uint16_t	oplen;
    uint32_t	pc = 0;

    while (pc < len)
    {
        op = bc[pc];
        b = op & kNBCFieldMask;
        a = (op & 0xff)>>3;

        if (b == kNBCFieldMask)
        {
            oplen = 3;

            b = (int16_t)bc[pc + 1] << 8;
            b += bc[pc + 2];

            if (a == 0)
            {
                if (b == 0x01)
                    b = kNBCFieldMask;
            }
        }
        else
        {
            oplen = 1;
        }

        NVMDumpInstCode(f, bc, pc, oplen);
        NVMDumpInstName(f, a, b);
        NewtFprintf(f, "\n");

        pc += oplen;
    }
}